

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O1

void __thiscall Basis::rebuild(Basis *this)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  value_type_conflict2 local_c;
  
  this->updatessinceinvert = 0;
  piVar1 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  local_c = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->constraintindexinbasisfactor,
             (long)(this->Atran).num_col + (long)(this->Atran).num_row,&local_c);
  HFactor::build(&this->basisfactor,(HighsTimerClock *)0x0);
  lVar3 = ((long)(this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2) +
          ((long)(this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  if (lVar3 != 0) {
    piVar1 = (this->baseindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      piVar2[piVar1[lVar4]] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  this->reinversion_hint = false;
  return;
}

Assistant:

void Basis::rebuild() {
  //  report();

  updatessinceinvert = 0;
  constraintindexinbasisfactor.clear();

  constraintindexinbasisfactor.assign(Atran.num_row + Atran.num_col, -1);
  assert((HighsInt)(non_active_constraint_index.size() +
                    active_constraint_index.size()) == Atran.num_row);

  basisfactor.build();

  for (size_t i = 0;
       i < active_constraint_index.size() + non_active_constraint_index.size();
       i++) {
    constraintindexinbasisfactor[baseindex[i]] = i;
  }
  reinversion_hint = false;
}